

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddLinear.c
# Opt level: O0

int cuddInitLinear(DdManager *table)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  long *linear;
  int i;
  int bit;
  int word;
  int nvars;
  int wordsPerRow;
  int words;
  DdManager *table_local;
  
  iVar1 = table->size;
  iVar2 = (iVar1 + -1 >> 6) + 1;
  iVar3 = iVar2 * iVar1;
  plVar4 = (long *)malloc((long)iVar3 << 3);
  table->linear = plVar4;
  if (plVar4 == (long *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
    table_local._4_4_ = 0;
  }
  else {
    table->memused = (long)iVar3 * 8 + table->memused;
    table->linearSize = iVar1;
    for (linear._0_4_ = 0; (int)linear < iVar3; linear._0_4_ = (int)linear + 1) {
      plVar4[(int)linear] = 0;
    }
    for (linear._0_4_ = 0; (int)linear < iVar1; linear._0_4_ = (int)linear + 1) {
      plVar4[iVar2 * (int)linear + ((int)linear >> 6)] = (long)(1 << ((byte)(int)linear & 0x1f));
    }
    table_local._4_4_ = 1;
  }
  return table_local._4_4_;
}

Assistant:

int
cuddInitLinear(
  DdManager * table)
{
    int words;
    int wordsPerRow;
    int nvars;
    int word;
    int bit;
    int i;
    long *linear;

    nvars = table->size;
    wordsPerRow = ((nvars - 1) >> LOGBPL) + 1;
    words = wordsPerRow * nvars;
    table->linear = linear = ABC_ALLOC(long,words);
    if (linear == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    table->memused += words * sizeof(long);
    table->linearSize = nvars;
    for (i = 0; i < words; i++) linear[i] = 0;
    for (i = 0; i < nvars; i++) {
        word = wordsPerRow * i + (i >> LOGBPL);
        bit  = i & (BPL-1);
        linear[word] = 1 << bit;
    }
    return(1);

}